

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_strtable_lookup2(upb_strtable *t,char *key,size_t len,upb_value *v)

{
  uint32_t hash;
  upb_tabent *puVar1;
  lookupkey_t key_00;
  
  hash = _upb_Hash_NoSeed(key,len);
  key_00.str.size = len;
  key_00.str.data = key;
  puVar1 = findentry(&t->t,key_00,hash,streql);
  if (v != (upb_value *)0x0 && puVar1 != (upb_tabent *)0x0) {
    v->val = (puVar1->val).val;
  }
  return puVar1 != (upb_tabent *)0x0;
}

Assistant:

bool upb_strtable_lookup2(const upb_strtable* t, const char* key, size_t len,
                          upb_value* v) {
  uint32_t hash = _upb_Hash_NoSeed(key, len);
  return lookup(&t->t, strkey2(key, len), v, hash, &streql);
}